

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  int arg0i;
  float arg1f;
  int arg1i;
  int data_backup [2];
  double local_68;
  undefined8 local_60;
  size_t local_58;
  double *local_50;
  int local_44;
  char *local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar2 = *buf;
    uVar7 = (ulong)bVar2;
    if (0x2f < uVar7) break;
    if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0025003c;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar6 = 0;
  bVar1 = bVar2;
LAB_00250055:
  if (bVar1 == 0) {
    return false;
  }
  local_58 = GDataTypeInfo[data_type].Size;
  local_50 = (double *)p_data;
  local_40 = initial_value_buf;
  memcpy(local_38,p_data,local_58);
  if (format == (char *)0x0) {
    format = GDataTypeInfo[data_type].ScanFmt;
  }
  local_44 = 0;
  if (data_type == 9) {
    local_68 = *local_50;
    local_60 = 0.0;
    if ((bVar6 != 0) && (iVar4 = __isoc99_sscanf(local_40,"%lf",&local_68), iVar4 < 1)) {
      return false;
    }
    iVar4 = __isoc99_sscanf(buf,"%lf",&local_60);
    if (iVar4 < 1) {
      return false;
    }
    if (bVar6 == 0x2a) {
      dVar9 = local_68 * local_60;
    }
    else if (bVar6 == 0x2f) {
      if ((local_60 == 0.0) && (!NAN(local_60))) goto switchD_002502b0_default;
      dVar9 = local_68 / local_60;
    }
    else {
      dVar9 = local_60;
      if (bVar6 == 0x2b) {
        dVar9 = local_68 + local_60;
      }
    }
    *local_50 = dVar9;
    goto switchD_002502b0_default;
  }
  if (data_type == 8) {
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)local_50);
    if ((bVar6 != 0) && (iVar4 = __isoc99_sscanf(local_40,"%f",&local_68), iVar4 < 1)) {
      return false;
    }
    iVar4 = __isoc99_sscanf(buf,"%f",&local_60);
    if (iVar4 < 1) {
      return false;
    }
    if (bVar6 == 0x2a) {
      fVar8 = local_68._0_4_ * (float)local_60;
    }
    else if (bVar6 == 0x2f) {
      if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto switchD_002502b0_default;
      fVar8 = local_68._0_4_ / (float)local_60;
    }
    else {
      fVar8 = (float)local_60;
      if (bVar6 == 0x2b) {
        fVar8 = local_68._0_4_ + (float)local_60;
      }
    }
    *(float *)local_50 = fVar8;
    goto switchD_002502b0_default;
  }
  if (data_type == 4) {
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)local_50);
    if (bVar6 == 0) {
LAB_002502d0:
      iVar5 = __isoc99_sscanf(buf,format,&local_44);
      iVar4 = local_44;
      if (iVar5 != 1) goto switchD_002502b0_default;
    }
    else {
      iVar4 = __isoc99_sscanf(local_40,format,&local_68);
      if (iVar4 < 1) {
        return false;
      }
      if (bVar6 == 0x2a) {
        iVar4 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar4 == 0) goto switchD_002502b0_default;
        fVar8 = (float)(int)local_68._0_4_ * (float)local_60;
      }
      else {
        if (bVar6 != 0x2f) {
          if (bVar6 != 0x2b) goto LAB_002502d0;
          iVar4 = __isoc99_sscanf(buf,"%d",&local_44);
          if (iVar4 == 0) goto switchD_002502b0_default;
          iVar4 = local_44 + (int)local_68._0_4_;
          goto LAB_0025046b;
        }
        iVar4 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar4 == 0) goto switchD_002502b0_default;
        if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto switchD_002502b0_default;
        fVar8 = (float)(int)local_68._0_4_ / (float)local_60;
      }
      iVar4 = (int)fVar8;
    }
LAB_0025046b:
    *(int *)local_50 = iVar4;
    goto switchD_002502b0_default;
  }
  if (data_type - 5U < 3) {
    __isoc99_sscanf(buf,format);
    goto switchD_002502b0_default;
  }
  __isoc99_sscanf(buf,format,&local_68);
  switch(data_type) {
  case 0:
    iVar4 = 0x7f;
    if ((int)local_68._0_4_ < 0x7f) {
      iVar4 = (int)local_68._0_4_;
    }
    bVar2 = 0x80;
    if (-0x80 < iVar4) {
      bVar2 = (byte)iVar4;
    }
    break;
  case 1:
    iVar4 = 0xff;
    if ((int)local_68._0_4_ < 0xff) {
      iVar4 = (int)local_68._0_4_;
    }
    bVar2 = ~(byte)(iVar4 >> 0x1f) & (byte)iVar4;
    break;
  case 2:
    iVar4 = 0x7fff;
    if ((int)local_68._0_4_ < 0x7fff) {
      iVar4 = (int)local_68._0_4_;
    }
    uVar3 = 0x8000;
    if (-0x8000 < iVar4) {
      uVar3 = (ushort)iVar4;
    }
    goto LAB_002503d4;
  case 3:
    iVar4 = 0xffff;
    if ((int)local_68._0_4_ < 0xffff) {
      iVar4 = (int)local_68._0_4_;
    }
    uVar3 = ~(ushort)(iVar4 >> 0x1f) & (ushort)iVar4;
LAB_002503d4:
    *(ushort *)local_50 = uVar3;
  default:
    goto switchD_002502b0_default;
  }
  *(byte *)local_50 = bVar2;
switchD_002502b0_default:
  iVar4 = bcmp(local_38,local_50,local_58);
  return iVar4 != 0;
LAB_0025003c:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
      bVar1 = *buf;
    } while (bVar1 == 0x20);
    bVar6 = bVar2;
  } while (bVar1 == 9);
  goto LAB_00250055;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    const ImGuiDataTypeInfo* type_info = ImGui::DataTypeGetInfo(data_type);
    IM_ASSERT(type_info->Size <= sizeof(data_backup));
    memcpy(data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, p_data);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(data_backup, p_data, type_info->Size) != 0;
}